

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O3

Move * cuddZddSymmSifting_down(DdManager *table,int x,int x_high,int initial_size)

{
  DdHalfWord DVar1;
  DdSubtable *pDVar2;
  DdHalfWord DVar3;
  DdHalfWord y;
  int iVar4;
  DdHalfWord DVar5;
  DdNode *pDVar6;
  DdHalfWord x_00;
  DdNode *pDVar7;
  DdNode *local_40;
  int local_34;
  
  local_40 = (DdNode *)0x0;
  y = cuddZddNextHigh(table,x);
  local_34 = x_high;
  if (x_high < (int)y) {
    local_40 = (DdNode *)0x0;
  }
  else {
    do {
      DVar1 = table->subtableZ[(int)y].next;
      do {
        x_00 = DVar1;
        DVar1 = table->subtableZ[(int)x_00].next;
      } while (DVar1 != y);
      iVar4 = cuddZddSymmCheck(table,x,y);
      pDVar2 = table->subtableZ;
      DVar1 = pDVar2[x].next;
      if (iVar4 == 0) {
        if ((DVar1 == x) && (pDVar2[(int)y].next == y)) {
          iVar4 = cuddZddSwapInPlace(table,x,y);
          if ((iVar4 == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0)) {
            if (local_40 == (DdNode *)0x0) {
              return (Move *)0x1;
            }
            pDVar6 = table->nextFree;
            do {
              pDVar7 = local_40;
              local_40 = (pDVar7->type).kids.T;
              pDVar7->ref = 0;
              pDVar7->next = pDVar6;
              pDVar6 = pDVar7;
            } while (local_40 != (DdNode *)0x0);
            table->nextFree = pDVar7;
            return (Move *)0x1;
          }
          pDVar6->index = x;
          pDVar6->ref = y;
          *(int *)((long)&pDVar6->next + 4) = iVar4;
          (pDVar6->type).kids.T = local_40;
          if ((double)initial_size * table->maxGrowth < (double)iVar4) {
            return (Move *)pDVar6;
          }
          if (iVar4 < initial_size) {
            initial_size = iVar4;
          }
          local_40 = pDVar6;
          cuddZddNextHigh(table,y);
        }
        else {
          iVar4 = zdd_group_move(table,x,y,(Move **)&local_40);
          if ((double)initial_size * table->maxGrowth < (double)iVar4) {
            return (Move *)local_40;
          }
          if (iVar4 < initial_size) {
            initial_size = iVar4;
          }
        }
      }
      else {
        pDVar2[x].next = y;
        DVar3 = pDVar2[(int)y].next;
        do {
          DVar5 = DVar3;
          DVar3 = pDVar2[(int)DVar5].next;
        } while (pDVar2[(int)DVar5].next != y);
        pDVar2[(int)DVar5].next = DVar1;
      }
      y = cuddZddNextHigh(table,x_00);
      x = x_00;
    } while ((int)y <= local_34);
  }
  return (Move *)local_40;
}

Assistant:

static Move *
cuddZddSymmSifting_down(
  DdManager * table,
  int  x,
  int  x_high,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;
    int         i, gxtop, gybot;

    moves = NULL;
    y = cuddZddNextHigh(table, x);
    while (y <= x_high) {
        gybot = table->subtableZ[y].next;
        while (table->subtableZ[gybot].next != (unsigned) y)
            gybot = table->subtableZ[gybot].next;
        if (cuddZddSymmCheck(table, x, y)) {
            /* Symmetry found, attach symm groups */
            gxtop = table->subtableZ[x].next;
            table->subtableZ[x].next = y;
            i = table->subtableZ[y].next;
            while (table->subtableZ[i].next != (unsigned) y)
                i = table->subtableZ[i].next;
            table->subtableZ[i].next = gxtop;
        }
        else if ((table->subtableZ[x].next == (unsigned) x) &&
            (table->subtableZ[y].next == (unsigned) y)) {
            /* x and y have self symmetry */
            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto cuddZddSymmSifting_downOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto cuddZddSymmSifting_downOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
            x = y;
            y = cuddZddNextHigh(table, x);
        }
        else { /* Group move */
            size = zdd_group_move(table, x, y, &moves);
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        x = gybot;
        y = cuddZddNextHigh(table, x);
    }

    return(moves);

cuddZddSymmSifting_downOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(ZDD_MV_OOM);

}